

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGStructurizer::continue_block_can_merge(CFGStructurizer *this,CFGNode *node)

{
  CFGNode *this_00;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  CFGNode *pCVar4;
  CFGNode *pCVar5;
  size_type sVar6;
  reference ppCVar7;
  bool local_d9;
  CFGNode *pred_2;
  iterator __end1_2;
  iterator __begin1_2;
  Vector<CFGNode_*> *__range1_2;
  iterator iStack_a8;
  bool found_another_escape_edge;
  CFGNode **local_a0;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_98;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_90;
  CFGNode *local_88;
  CFGNode *common_post_dominator;
  CFGNode *pred_1;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<CFGNode_*> *__range1_1;
  CFGNode *natural_merge;
  CFGNode *merge;
  CFGNode *pred;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *header;
  CFGNode *pred_candidate;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  header = (CFGNode *)0x0;
  this_00 = node->succ_back_edge;
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&node->pred);
  pred = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&node->pred);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&pred), bVar2) {
    ppCVar7 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    pCVar4 = *ppCVar7;
    if (((pCVar4->succ_back_edge != (CFGNode *)0x0) && (this_00 != pCVar4->succ_back_edge)) &&
       (bVar2 = CFGNode::dominates(this_00,pCVar4->succ_back_edge), bVar2)) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  bVar2 = std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
          ::empty(&(node->ir).operations);
  if ((bVar2) && ((node->ir).terminator.type == Branch)) {
    this_local._7_1_ = false;
  }
  else {
    if ((this_00->ir).terminator.type == Switch) {
      pCVar4 = find_common_post_dominator(&this_00->succ);
      pCVar5 = find_natural_switch_merge_block(this,this_00,pCVar4);
      if ((pCVar4 == node) && (pCVar5 != pCVar4)) {
        return false;
      }
    }
    __end1_1 = std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin(&node->pred);
    pred_1 = (CFGNode *)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::end(&node->pred);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                               *)&pred_1), bVar2) {
      ppCVar7 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end1_1);
      common_post_dominator = *ppCVar7;
      uVar3 = CFGNode::num_forward_preds(common_post_dominator);
      if ((((1 < uVar3) &&
           (sVar6 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::size(&common_post_dominator->succ), 1 < sVar6)) &&
          (this_00 != common_post_dominator)) &&
         ((bVar2 = CFGNode::dominates(common_post_dominator,node), !bVar2 &&
          (bVar2 = CFGNode::post_dominates(node,common_post_dominator), !bVar2)))) {
        local_88 = CFGNode::find_common_post_dominator(node,common_post_dominator);
        local_d9 = false;
        if (local_88 != (CFGNode *)0x0) {
          local_98._M_current =
               (CFGNode **)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin(&node->succ);
          local_a0 = (CFGNode **)
                     std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::end(&node->succ);
          local_90 = std::
                     find<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGNode*>
                               (local_98,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                          )local_a0,&local_88);
          iStack_a8 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::end(&node->succ);
          local_d9 = __gnu_cxx::operator==(&local_90,&stack0xffffffffffffff58);
        }
        if (local_d9 != false) {
          header = common_post_dominator;
        }
      }
      if (((common_post_dominator->ir).terminator.type == Switch) &&
         (bVar2 = CFGNode::post_dominates(node,common_post_dominator), !bVar2)) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end1_1);
    }
    if (header == (CFGNode *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = 0;
      __end1_2 = std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 begin(&node->pred);
      pred_2 = (CFGNode *)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end(&node->pred);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                 *)&pred_2), bVar2) {
        ppCVar7 = __gnu_cxx::
                  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                  ::operator*(&__end1_2);
        pCVar4 = *ppCVar7;
        if (((pCVar4 != this_00) && (pCVar4 != header)) &&
           (bVar2 = CFGNode::dominates(pCVar4,node), !bVar2)) {
          bVar1 = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
        ::operator++(&__end1_2);
      }
      this_local._7_1_ = (bool)(bVar1 ^ 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CFGStructurizer::continue_block_can_merge(CFGNode *node) const
{
	const CFGNode *pred_candidate = nullptr;
	auto *header = node->succ_back_edge;

	// This algorithm is very arbitrary and should be seen as a nasty heuristic which solves real shaders
	// we see in the wild. It's probably safe to block continue merge in far more cases than this, but we
	// want to be maximally convergent as often as we can.

	for (auto *pred : node->pred)
	{
		// This is the merge block of another inner loop, we really need an intermediate merge.
		if (pred->succ_back_edge && header != pred->succ_back_edge && header->dominates(pred->succ_back_edge))
			return true;
	}

	// Plain continue block that does nothing useful. No point merging this.
	// A continue block's succ is sometimes used to aid analysis and simplify other passes,
	// use terminator here explicitly.
	if (node->ir.operations.empty() && node->ir.terminator.type == Terminator::Type::Branch)
		return false;

	if (header->ir.terminator.type == Terminator::Type::Switch)
	{
		// If the loop header is also a switch statement, there can be some nasty edge cases.
		// We likely never intend for the continue block to be maximally convergent here
		// if the natural merge block is not the continue block.
		auto *merge = find_common_post_dominator(header->succ);
		auto *natural_merge = find_natural_switch_merge_block(header, merge);
		if (merge == node && natural_merge != merge)
			return false;
	}

	for (auto *pred : node->pred)
	{
		// If we have a situation where a continue block has a pred which is itself a selection merge target, that
		// block is the merge target where we follow maximum convergence.
		// The candidate must be inside loop body and not the header itself.
		// Neither continue block nor merge target have any dominance relationship.

		if (pred->num_forward_preds() >= 2 && pred->succ.size() >= 2 &&
		    header != pred && !pred->dominates(node) &&
		    !node->post_dominates(pred))
		{
			// If execution does not merge up right at the natural break block,
			// things will get very complicated.
			// In practice, we can handle merges as long as the candidate just breaks out normally.
			// If not, we have to introduce ladder breaking and this is (almost) impossible to get right.
			auto *common_post_dominator = CFGNode::find_common_post_dominator(node, pred);
			if (common_post_dominator &&
			    std::find(node->succ.begin(), node->succ.end(), common_post_dominator) == node->succ.end())
			{
				pred_candidate = pred;
			}
		}

		// If we have a situation where a switch block inside our loop uses the continue block
		// as a continue target, it's important that we keep this block as a continue block,
		// otherwise, it will complicate the switch block greatly.
		if (pred->ir.terminator.type == Terminator::Type::Switch && !node->post_dominates(pred))
			return false;
	}

	// No obviously nasty case to handle, probably safe to let the algorithm do its thing ...
	if (!pred_candidate)
		return true;

	// Need to find another escape edge which is neither header nor the candidate.
	bool found_another_escape_edge = false;
	for (auto *pred : node->pred)
	{
		if (pred != header && pred != pred_candidate && !pred->dominates(node))
		{
			found_another_escape_edge = true;
			break;
		}
	}

	// If we have yet another escape edge, we probably cannot merge to continue ...
	return !found_another_escape_edge;
}